

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countryflags.cpp
# Opt level: O3

void __thiscall CCountryFlags::LoadCountryflagsIndexfile(CCountryFlags *this)

{
  IStorage *pIVar1;
  json_object_entry *pjVar2;
  IGraphics *pIVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  char *pcVar7;
  json_value *value;
  ulong uVar8;
  _json_value *p_Var9;
  _func_int **pp_Var10;
  bool bVar11;
  _json_value *p_Var12;
  int64_t iVar13;
  CCountryFlag *pCVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  IConsole *pIVar18;
  _json_value *p_Var19;
  CCountryFlag *pCVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  plain_range_sorted<CCountryFlags::CCountryFlag> range;
  CImageInfo Info;
  json_settings JsonSettings;
  char aMsg [64];
  CCountryFlag CountryFlag;
  char aBuf [64];
  char aError [256];
  undefined1 auVar26 [16];
  _json_value *local_240;
  uint local_220;
  uint local_21c;
  uint local_218;
  void *local_210;
  json_settings local_208;
  char local_1d8 [76];
  CCountryFlag local_18c;
  char local_178 [64];
  char local_138 [256];
  long local_38;
  IOHANDLE io;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pStorage;
  auVar26 = (undefined1  [16])0x0;
  iVar4 = (*(pIVar1->super_IInterface)._vptr_IInterface[4])
                    (pIVar1,"countryflags/index.json",1,0xffffffff,0,0,(undefined1  [16])0x0);
  io = (IOHANDLE)CONCAT44(extraout_var,iVar4);
  if (io == (IOHANDLE)0x0) {
    pIVar18 = ((this->super_CComponent).m_pClient)->m_pConsole;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (*(pIVar18->super_IInterface)._vptr_IInterface[0x19])
                (pIVar18,1,"countryflags","couldn\'t open index file",0);
      return;
    }
  }
  else {
    lVar6 = io_length(io);
    uVar17 = (uint)lVar6;
    pcVar7 = (char *)mem_alloc(uVar17);
    io_read(io,pcVar7,uVar17);
    io_close(io);
    mem_zero(&local_208,0x30);
    value = json_parse_ex(&local_208,pcVar7,(long)(int)uVar17,local_138);
    mem_free(pcVar7);
    if (value == (json_value *)0x0) {
      pIVar18 = ((this->super_CComponent).m_pClient)->m_pConsole;
      (*(pIVar18->super_IInterface)._vptr_IInterface[0x19])
                (pIVar18,1,"countryflags/index.json",local_138,0);
    }
    else {
      local_240 = &json_value_none;
      if ((value->type == json_object) && (uVar8 = (ulong)(value->u).string.length, uVar8 != 0)) {
        pjVar2 = (value->u).object.values;
        lVar6 = 0;
        do {
          iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar6),"country codes");
          if (iVar4 == 0) {
            local_240 = *(_json_value **)((long)&pjVar2->value + lVar6);
            break;
          }
          lVar6 = lVar6 + 0x18;
        } while (uVar8 * 0x18 != lVar6);
      }
      if (local_240->type == json_object) {
        lVar6 = 0;
        bVar22 = true;
        do {
          bVar11 = bVar22;
          p_Var19 = &json_value_none;
          if (local_240->type == json_object) {
            uVar8 = (ulong)(local_240->u).string.length;
            p_Var19 = &json_value_none;
            if (uVar8 != 0) {
              iVar4 = (&DAT_001d9728)[lVar6];
              pjVar2 = (local_240->u).object.values;
              lVar6 = 0;
              do {
                iVar5 = strcmp(*(char **)((long)&pjVar2->name + lVar6),
                               (char *)((long)&DAT_001d9728 + (long)iVar4));
                if (iVar5 == 0) {
                  p_Var19 = *(_json_value **)((long)&pjVar2->value + lVar6);
                  goto LAB_0013de2a;
                }
                lVar6 = lVar6 + 0x18;
              } while (uVar8 * 0x18 != lVar6);
              p_Var19 = &json_value_none;
            }
          }
LAB_0013de2a:
          if ((p_Var19->type == json_array) &&
             (uVar17 = (p_Var19->u).string.length, uVar8 = (ulong)uVar17, uVar17 != 0)) {
            uVar21 = 0;
            do {
              bVar22 = p_Var19->type == json_array;
              iVar4 = (int)uVar21;
              p_Var12 = &json_value_none;
              if ((uVar21 < uVar8 && -1 < iVar4) && bVar22) {
                p_Var12 = *(_json_value **)((p_Var19->u).string.ptr + uVar21 * 8);
              }
              p_Var9 = &json_value_none;
              if (p_Var12->type == json_object) {
                uVar15 = (ulong)(p_Var12->u).string.length;
                p_Var9 = &json_value_none;
                if (uVar15 != 0) {
                  pjVar2 = (p_Var12->u).object.values;
                  lVar6 = 0;
                  do {
                    iVar5 = strcmp(*(char **)((long)&pjVar2->name + lVar6),"code");
                    if (iVar5 == 0) {
                      p_Var9 = *(_json_value **)((long)&pjVar2->value + lVar6);
                      goto LAB_0013dee0;
                    }
                    lVar6 = lVar6 + 0x18;
                  } while (uVar15 * 0x18 != lVar6);
                  p_Var9 = &json_value_none;
                }
              }
LAB_0013dee0:
              if (p_Var9->type == json_double) {
                iVar13 = (int64_t)(p_Var9->u).dbl;
LAB_0013defb:
                if (0xfffffc16 < (int)iVar13 - 1000U) goto LAB_0013df2f;
                str_format(local_178,0x40,"country code \'%i\' not within valid code range [%i..%i]"
                           ,iVar13,0xffffffff,999);
LAB_0013e18e:
                pcVar7 = local_178;
                pIVar18 = ((this->super_CComponent).m_pClient)->m_pConsole;
                pp_Var10 = (pIVar18->super_IInterface)._vptr_IInterface;
LAB_0013e1ab:
                (*pp_Var10[0x19])(pIVar18,1,"countryflags",pcVar7,0);
              }
              else {
                iVar13 = 0;
                if (p_Var9->type == json_integer) {
                  iVar13 = (p_Var9->u).integer;
                  goto LAB_0013defb;
                }
LAB_0013df2f:
                p_Var12 = &json_value_none;
                if ((uVar21 < uVar8 && -1 < iVar4) && bVar22) {
                  p_Var12 = *(_json_value **)((p_Var19->u).string.ptr + uVar21 * 8);
                }
                p_Var9 = &json_value_none;
                if (p_Var12->type == json_object) {
                  uVar8 = (ulong)(p_Var12->u).string.length;
                  p_Var9 = &json_value_none;
                  if (uVar8 != 0) {
                    pjVar2 = (p_Var12->u).object.values;
                    lVar6 = 0;
                    do {
                      pcVar7 = *(char **)((long)&pjVar2->name + lVar6);
                      if (((*pcVar7 == 'i') && (pcVar7[1] == 'd')) && (pcVar7[2] == '\0')) {
                        p_Var9 = *(_json_value **)((long)&pjVar2->value + lVar6);
                        goto LAB_0013df8a;
                      }
                      lVar6 = lVar6 + 0x18;
                    } while (uVar8 * 0x18 != lVar6);
                    p_Var9 = &json_value_none;
                  }
                }
LAB_0013df8a:
                pcVar7 = "";
                if (p_Var9->type == json_string) {
                  pcVar7 = (p_Var9->u).string.ptr;
                }
                local_18c.m_Texture.m_Id = -1;
                local_18c.m_CountryCode = (int)iVar13;
                str_copy(local_18c.m_aCountryCodeString,pcVar7,8);
                if (((this->super_CComponent).m_pClient)->m_pConfig->m_ClLoadCountryFlags != 0) {
                  str_format(local_178,0x40,"countryflags/%s.png",pcVar7);
                  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
                  iVar5 = (*(pIVar3->super_IInterface)._vptr_IInterface[0xe])
                                    (pIVar3,&local_220,local_178,0xffffffff);
                  if (iVar5 != 0) {
                    pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
                    auVar25._12_4_ = 0;
                    auVar25._0_12_ = auVar26._4_12_;
                    auVar26 = auVar25 << 0x20;
                    local_18c.m_Texture.m_Id =
                         (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])
                                   (pIVar3,(ulong)local_220,(ulong)local_21c,(ulong)local_218,
                                    local_210,(ulong)local_218,auVar26);
                    mem_free(local_210);
                    goto LAB_0013e055;
                  }
                  pcVar7 = local_1d8;
                  str_format(pcVar7,0x40,"failed to load \'%s\'",local_178);
                  pIVar18 = ((this->super_CComponent).m_pClient)->m_pConsole;
                  pp_Var10 = (pIVar18->super_IInterface)._vptr_IInterface;
                  goto LAB_0013e1ab;
                }
LAB_0013e055:
                local_18c.m_Blocked = false;
                p_Var12 = &json_value_none;
                if (((-1 < iVar4) && (p_Var12 = &json_value_none, p_Var19->type == json_array)) &&
                   (p_Var12 = &json_value_none, uVar21 < (p_Var19->u).string.length)) {
                  p_Var12 = *(_json_value **)((p_Var19->u).string.ptr + uVar21 * 8);
                }
                p_Var9 = &json_value_none;
                if (p_Var12->type == json_object) {
                  uVar8 = (ulong)(p_Var12->u).string.length;
                  p_Var9 = &json_value_none;
                  if (uVar8 != 0) {
                    pjVar2 = (p_Var12->u).object.values;
                    lVar6 = 0;
                    do {
                      iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar6),"blocked");
                      if (iVar4 == 0) {
                        p_Var9 = *(_json_value **)((long)&pjVar2->value + lVar6);
                        goto LAB_0013e13b;
                      }
                      lVar6 = lVar6 + 0x18;
                    } while (uVar8 * 0x18 != lVar6);
                    p_Var9 = &json_value_none;
                  }
                }
LAB_0013e13b:
                if ((p_Var9->type == json_boolean) && ((p_Var9->u).boolean != 0)) {
                  local_18c.m_Blocked = true;
                }
                array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                ::add(&(this->m_aCountryFlags).
                       super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                      ,&local_18c);
                if (((this->super_CComponent).m_pClient)->m_pConfig->m_Debug != 0) {
                  str_format(local_178,0x40,"loaded country flag \'%s\'",pcVar7);
                  goto LAB_0013e18e;
                }
              }
              uVar21 = uVar21 + 1;
              uVar8 = (ulong)(p_Var19->u).string.length;
            } while (uVar21 < uVar8);
          }
          lVar6 = 1;
          bVar22 = false;
        } while (bVar11);
      }
      json_value_free(value);
      lVar6 = (long)(this->m_aCountryFlags).
                    super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                    .num_elements;
      if (0 < lVar6) {
        pCVar14 = (this->m_aCountryFlags).
                  super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                  .list;
        range.super_plain_range<CCountryFlags::CCountryFlag>.end = pCVar14 + lVar6;
        range.super_plain_range<CCountryFlags::CCountryFlag>.begin = pCVar14;
        sort<plain_range_sorted<CCountryFlags::CCountryFlag>>(range);
        lVar6 = (long)(this->m_aCountryFlags).
                      super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                      .num_elements;
        if (0 < lVar6) {
          pCVar20 = (this->m_aCountryFlags).
                    super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                    .list;
          pCVar14 = pCVar20 + lVar6;
          iVar4 = 0;
LAB_0013e235:
          dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                         ,0x96,1,"empty");
          auVar26 = _DAT_001d4390;
          if (pCVar20->m_CountryCode != -1) goto code_r0x0013e251;
          if (iVar4 != 0) {
            iVar4 = -iVar4;
            lVar6 = 0xb;
            auVar23 = _DAT_001d7d10;
            auVar24 = _DAT_001d4f30;
            do {
              auVar25 = auVar24 ^ auVar26;
              if (auVar25._4_4_ == -0x80000000 && auVar25._0_4_ < -0x7ffffc17) {
                this->m_CodeIndexLUT[lVar6 + -0xb] = iVar4;
                this->m_CodeIndexLUT[lVar6 + -10] = iVar4;
              }
              auVar25 = auVar23 ^ auVar26;
              if (auVar25._4_4_ == -0x80000000 && auVar25._0_4_ < -0x7ffffc17) {
                this->m_CodeIndexLUT[lVar6 + -9] = iVar4;
                this->m_CodeIndexLUT[lVar6 + -8] = iVar4;
              }
              lVar16 = auVar24._8_8_;
              auVar24._0_8_ = auVar24._0_8_ + 4;
              auVar24._8_8_ = lVar16 + 4;
              lVar16 = auVar23._8_8_;
              auVar23._0_8_ = auVar23._0_8_ + 4;
              auVar23._8_8_ = lVar16 + 4;
              lVar6 = lVar6 + 4;
            } while (lVar6 != 0x3f7);
            goto LAB_0013e354;
          }
        }
      }
LAB_0013e341:
      mem_zero(this->m_CodeIndexLUT,0xfa4);
LAB_0013e354:
      lVar6 = (long)(this->m_aCountryFlags).
                    super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                    .num_elements;
      if (0 < lVar6) {
        pCVar14 = (this->m_aCountryFlags).
                  super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                  .list;
        lVar16 = 0;
        do {
          uVar17 = pCVar14->m_CountryCode + ((pCVar14->m_CountryCode + 1) / 0x3e9) * -0x3e9 + 1;
          if ((int)uVar17 < 1) {
            uVar17 = 0;
          }
          this->m_CodeIndexLUT[uVar17] = (int)lVar16;
          lVar16 = lVar16 + 1;
          pCVar14 = pCVar14 + 1;
        } while (lVar6 != lVar16);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
code_r0x0013e251:
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                 ,0x94,1,"empty");
  pCVar20 = pCVar20 + 1;
  iVar4 = iVar4 + -1;
  if (pCVar14 <= pCVar20) goto LAB_0013e341;
  goto LAB_0013e235;
}

Assistant:

void CCountryFlags::LoadCountryflagsIndexfile()
{
	// read file data into buffer
	const char *pFilename = "countryflags/index.json";
	IOHANDLE File = Storage()->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", "couldn't open index file");
		return;
	}
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, pFilename, aError);
		return;
	}

	// extract data
	const json_value &rInit = (*pJsonData)["country codes"];
	if(rInit.type == json_object)
	{
		enum
		{
			NUM_INDICES = 2,
		};
		const char *paIndices[NUM_INDICES] = {"custom", "ISO 3166-1"};
		for(int Index = 0; Index < NUM_INDICES; ++Index)
		{
			const json_value &rStart = rInit[(const char *)paIndices[Index]];
			if(rStart.type == json_array)
			{
				for(unsigned i = 0; i < rStart.u.array.length; ++i)
				{
					char aBuf[64];

					// validate country code
					int CountryCode = (json_int_t)rStart[i]["code"];
					if(CountryCode < CODE_LB || CountryCode > CODE_UB)
					{
						str_format(aBuf, sizeof(aBuf), "country code '%i' not within valid code range [%i..%i]", CountryCode, CODE_LB, CODE_UB);
						Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", aBuf);
						continue;
					}

					// add entry
					const char *pCountryName = rStart[i]["id"];
					CCountryFlag CountryFlag;
					CountryFlag.m_CountryCode = CountryCode;
					str_copy(CountryFlag.m_aCountryCodeString, pCountryName, sizeof(CountryFlag.m_aCountryCodeString));
					if(Config()->m_ClLoadCountryFlags)
					{
						// load the graphic file
						CImageInfo Info;
						str_format(aBuf, sizeof(aBuf), "countryflags/%s.png", pCountryName);
						if(!Graphics()->LoadPNG(&Info, aBuf, IStorage::TYPE_ALL))
						{
							char aMsg[64];
							str_format(aMsg, sizeof(aMsg), "failed to load '%s'", aBuf);
							Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", aMsg);
							continue;
						}
						CountryFlag.m_Texture = Graphics()->LoadTextureRaw(Info.m_Width, Info.m_Height, Info.m_Format, Info.m_pData, Info.m_Format, 0);
						mem_free(Info.m_pData);
					}
					// blocked?
					CountryFlag.m_Blocked = false;
					const json_value Check = rStart[i]["blocked"];
					if(Check.type == json_boolean && Check)
						CountryFlag.m_Blocked = true;
					m_aCountryFlags.add_unsorted(CountryFlag);

					// print message
					if(Config()->m_Debug)
					{
						str_format(aBuf, sizeof(aBuf), "loaded country flag '%s'", pCountryName);
						Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", aBuf);
					}
				}
			}
		}
	}

	// clean up
	json_value_free(pJsonData);
	m_aCountryFlags.sort_range();

	// find index of default item
	int DefaultIndex = 0, Index = 0;
	for(sorted_array<CCountryFlag>::range r = m_aCountryFlags.all(); !r.empty(); r.pop_front(), ++Index)
		if(r.front().m_CountryCode == -1)
		{
			DefaultIndex = Index;
			break;
		}

	// init LUT
	if(DefaultIndex != 0)
		for(int i = 0; i < CODE_RANGE; ++i)
			m_CodeIndexLUT[i] = DefaultIndex;
	else
		mem_zero(m_CodeIndexLUT, sizeof(m_CodeIndexLUT));
	for(int i = 0; i < m_aCountryFlags.size(); ++i)
		m_CodeIndexLUT[maximum(0, (m_aCountryFlags[i].m_CountryCode-CODE_LB)%CODE_RANGE)] = i;
}